

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void run<fse>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *input_name)

{
  pointer puVar1;
  pointer puVar2;
  uint32_t *a;
  pointer puVar3;
  pointer puVar4;
  pointer pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  long lVar10;
  long lVar11;
  unsigned_long in_size;
  uint8_t *in_u8;
  size_t n;
  size_t unaff_R12;
  ulong uVar12;
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar15 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM4 [16];
  pair<double,_unsigned_long> pVar16;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> recover;
  undefined8 local_88 [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  string local_50;
  undefined1 auVar14 [64];
  undefined1 auVar13 [16];
  
  pVar16 = compute_entropy(input);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&encoded_data,
             ((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start) * 2,(allocator_type *)local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&tmp_buf,((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                            ._M_impl.super__Vector_impl_data._M_start) * 2,
             (allocator_type *)local_88);
  bVar9 = true;
  uVar12 = 0xffffffffffffffff;
  while (auVar15 = in_ZMM2._0_16_, bVar9) {
    lVar10 = std::chrono::_V2::system_clock::now();
    puVar1 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    unaff_R12 = FSE_compress(encoded_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)encoded_data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)encoded_data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,puVar1,
                             (long)(input->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    lVar11 = std::chrono::_V2::system_clock::now();
    if ((ulong)(lVar11 - lVar10) <= uVar12) {
      uVar12 = lVar11 - lVar10;
    }
    bVar9 = false;
  }
  puVar1 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&encoded_data,unaff_R12);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&recover,(long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                            ._M_impl.super__Vector_impl_data._M_start >> 2,
             (allocator_type *)local_88);
  lVar10 = std::chrono::_V2::system_clock::now();
  FSE_decompress(recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                 encoded_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (long)encoded_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)encoded_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
  lVar11 = std::chrono::_V2::system_clock::now();
  a = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start;
  puVar3 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  fse::name_abi_cxx11_();
  n = (long)puVar3 - (long)a >> 2;
  REQUIRE_EQUAL(a,recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,n,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  auVar14._8_56_ = extraout_var;
  auVar14._0_8_ = extraout_XMM1_Qa;
  auVar13 = auVar14._0_16_;
  puVar3 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar5 = (input_name->_M_dataplus)._M_p;
  fse::name_abi_cxx11_();
  auVar6 = vcvtusi2sd_avx512f(auVar13,n);
  auVar13 = vcvtusi2sd_avx512f(auVar13,lVar11 - lVar10);
  auVar7 = vcvtusi2sd_avx512f(auVar15,(long)puVar2 - (long)puVar1 >> 2);
  auVar15 = vcvtusi2sd_avx512f(auVar15,uVar12);
  auVar8 = vcvtusi2sd_avx512f(in_XMM4,unaff_R12 << 3);
  printf("%25.25s\t\t%15u\t\t%15u\t\t%18.18s\t\t%2.4f\t\t%2.4f\t\t%2.3f\t\t%2.3f\t\t\n",pVar16.first
         ,auVar8._0_8_ / auVar7._0_8_,auVar15._0_8_ / auVar7._0_8_,auVar13._0_8_ / auVar6._0_8_,
         pcVar5,(ulong)((long)puVar4 - (long)puVar3) >> 2 & 0xffffffff,pVar16.second,local_88[0]);
  std::__cxx11::string::~string((string *)local_88);
  fflush(_stdout);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&recover.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&encoded_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void run(std::vector<uint32_t>& input, std::string input_name)
{
    // (0) compute entropy
    auto [input_entropy, sigma] = compute_entropy(input);

    // (1) encode
    std::vector<uint8_t> encoded_data(input.size() * 8);
    std::vector<uint8_t> tmp_buf(input.size() * 8);

    size_t encoded_bytes;
    size_t encoding_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_encode = std::chrono::high_resolution_clock::now();
        encoded_bytes = t_compressor::encode(input.data(), input.size(),
            encoded_data.data(), encoded_data.size(), tmp_buf.data());
        auto stop_encode = std::chrono::high_resolution_clock::now();
        auto encoding_time_ns = stop_encode - start_encode;
        encoding_time_ns_min
            = std::min((size_t)encoding_time_ns.count(), encoding_time_ns_min);
    }

    double BPI = double(encoded_bytes * 8) / double(input.size());
    double encode_IPS = compute_ips(input.size(), encoding_time_ns_min);
    double enc_ns_per_int = double(encoding_time_ns_min) / double(input.size());

    // (2) decode
    encoded_data.resize(encoded_bytes);
    std::vector<uint32_t> recover(input.size());
    size_t decode_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_decode = std::chrono::high_resolution_clock::now();
        t_compressor::decode(encoded_data.data(), encoded_data.size(),
            recover.data(), recover.size(), tmp_buf.data());
        auto stop_decode = std::chrono::high_resolution_clock::now();
        auto decode_time_ns = stop_decode - start_decode;
        decode_time_ns_min
            = std::min((size_t)decode_time_ns.count(), decode_time_ns_min);
    }
    double decode_IPS = compute_ips(input.size(), decode_time_ns_min);
    double dec_ns_per_int = double(decode_time_ns_min) / double(input.size());

    // (3) verify
    REQUIRE_EQUAL(
        input.data(), recover.data(), input.size(), t_compressor::name());

    // (4) output stats
    printf("%25.25s\t\t%15u\t\t%15u\t\t%18.18s\t\t%2.4f\t\t%2.4f\t\t%2.3f\t\t%"
           "2.3f\t\t\n",
        input_name.c_str(), (uint32_t)input.size(), (uint32_t)sigma,
        t_compressor::name().c_str(), input_entropy, BPI, enc_ns_per_int,
        dec_ns_per_int);
    fflush(stdout);
}